

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> * __thiscall
nonius::estimate::operator_cast_to_estimate
          (estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this)

{
  long in_RSI;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *in_RDI;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *__d;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffe0;
  undefined8 local_18;
  undefined8 local_10;
  
  __d = in_RDI;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffe0.__r,
             (duration<double,_std::ratio<1L,_1000000000L>_> *)in_RDI);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffe0.__r,
             (duration<double,_std::ratio<1L,_1000000000L>_> *)__d);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffe0.__r,
             (duration<double,_std::ratio<1L,_1000000000L>_> *)__d);
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::estimate
            (in_RDI,local_10,local_18,in_stack_ffffffffffffffe0,*(double *)(in_RSI + 0x18));
  return __d;
}

Assistant:

operator estimate<Duration2>() const {
            return estimate<Duration2>{ point, lower_bound, upper_bound, confidence_interval };
        }